

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompPredicate(xmlXPathParserContextPtr ctxt,int filter)

{
  byte bVar1;
  int ch1;
  byte *pbVar2;
  byte *pbVar3;
  
  ch1 = ctxt->comp->last;
  pbVar2 = ctxt->cur;
  while( true ) {
    pbVar3 = pbVar2 + 1;
    bVar1 = *pbVar2;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar3;
    pbVar2 = pbVar3;
  }
  if (bVar1 == 0x5b) {
    while( true ) {
      ctxt->cur = pbVar3;
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      pbVar3 = pbVar3 + 1;
    }
    ctxt->comp->last = -1;
    xmlXPathCompileExpr(ctxt,(uint)(filter != 0));
    if (ctxt->error == 0) {
      if (*ctxt->cur != ']') goto LAB_001e3732;
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_FILTER - (filter == 0),0,0,0,
                          (void *)0x0,(void *)0x0);
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      pbVar2 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar2 + 1;
        pbVar2 = pbVar2 + 1;
      }
    }
    return;
  }
LAB_001e3732:
  xmlXPathErr(ctxt,6);
  return;
}

Assistant:

static void
xmlXPathCompPredicate(xmlXPathParserContextPtr ctxt, int filter) {
    int op1 = ctxt->comp->last;

    SKIP_BLANKS;
    if (CUR != '[') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }
    NEXT;
    SKIP_BLANKS;

    ctxt->comp->last = -1;
    /*
    * This call to xmlXPathCompileExpr() will deactivate sorting
    * of the predicate result.
    * TODO: Sorting is still activated for filters, since I'm not
    *  sure if needed. Normally sorting should not be needed, since
    *  a filter can only diminish the number of items in a sequence,
    *  but won't change its order; so if the initial sequence is sorted,
    *  subsequent sorting is not needed.
    */
    if (! filter)
	xmlXPathCompileExpr(ctxt, 0);
    else
	xmlXPathCompileExpr(ctxt, 1);
    CHECK_ERROR;

    if (CUR != ']') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }

    if (filter)
	PUSH_BINARY_EXPR(XPATH_OP_FILTER, op1, ctxt->comp->last, 0, 0);
    else
	PUSH_BINARY_EXPR(XPATH_OP_PREDICATE, op1, ctxt->comp->last, 0, 0);

    NEXT;
    SKIP_BLANKS;
}